

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

void * icu_63::ZNames::createTimeZoneAndPutInCache
                 (UHashtable *cache,UChar **names,UnicodeString *tzID,UErrorCode *status)

{
  UChar *pUVar1;
  UChar *pUVar2;
  UChar *pUVar3;
  UChar *pUVar4;
  UChar *pUVar5;
  undefined4 uVar6;
  UChar *key;
  undefined8 *value;
  UnicodeString *name;
  void *__dest;
  size_t s;
  UnicodeString locationNameUniStr;
  UnicodeString local_70;
  
  if (U_ZERO_ERROR < *status) {
    return (void *)0x0;
  }
  name = (UnicodeString *)names;
  if (*names == (UChar *)0x0) {
    name = &local_70;
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f5be0;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    TimeZoneNamesImpl::getDefaultExemplarLocationName(tzID,name);
    uVar6 = local_70.fUnion.fFields.fLength;
    if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
      uVar6 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (0 < (int)uVar6) {
      name = (UnicodeString *)UnicodeString::getTerminatedBuffer(&local_70);
      if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
        local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      s = (size_t)(local_70.fUnion.fFields.fLength * 2 + 2);
      __dest = uprv_malloc_63(s);
      if (__dest == (void *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        UnicodeString::~UnicodeString(&local_70);
        return (void *)0x0;
      }
      memcpy(__dest,name,s);
      UnicodeString::~UnicodeString(&local_70);
      goto LAB_002110b0;
    }
    UnicodeString::~UnicodeString(&local_70);
  }
  __dest = (void *)0x0;
LAB_002110b0:
  key = ZoneMeta::findTimeZoneID(tzID);
  value = (undefined8 *)UMemory::operator_new((UMemory *)0x40,(size_t)name);
  if (value == (undefined8 *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    return (void *)0x0;
  }
  *(undefined1 *)(value + 7) = 0;
  pUVar1 = names[1];
  pUVar2 = names[2];
  pUVar3 = names[3];
  pUVar4 = names[4];
  pUVar5 = names[5];
  *value = *names;
  value[1] = pUVar1;
  value[2] = pUVar2;
  value[3] = pUVar3;
  value[4] = pUVar4;
  value[5] = pUVar5;
  value[6] = names[6];
  if (__dest != (void *)0x0) {
    *value = __dest;
  }
  *(bool *)((long)value + 0x39) = __dest != (void *)0x0;
  uhash_put_63(cache,key,value,status);
  return value;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }